

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall vera::Node::Node(Node *this)

{
  Node *this_local;
  
  this->_vptr_Node = (_func_int **)&PTR__Node_0076d0e0;
  std::vector<vera::Node_*,_std::allocator<vera::Node_*>_>::vector(&this->childs);
  this->bChange = true;
  glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&this->m_transformMatrix,1.0);
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&this->m_position,0.0);
  glm::qua<float,_(glm::qualifier)0>::qua(&this->m_orientation,1.0,0.0,0.0,0.0);
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&this->m_scale,1.0);
  return;
}

Assistant:

Node::Node(): 
    bChange(true),
    m_transformMatrix(1.0), 
    m_position(0.0),
    m_orientation(1.0, 0.0, 0.0, 0.0),
    m_scale(1.0) {
}